

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::ExternModuleDeclSyntax::getChild(ExternModuleDeclSyntax *this,size_t index)

{
  Token token;
  undefined8 in_RDX;
  long in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff98;
  Info *in_stack_ffffffffffffffa0;
  nullptr_t in_stack_ffffffffffffffa8;
  ConstTokenOrSyntax *in_stack_ffffffffffffffb0;
  
  switch(in_RDX) {
  case 0:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  case 1:
    token.info = in_stack_ffffffffffffffa0;
    token._0_8_ = in_stack_ffffffffffffff98;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x399083,token);
    break;
  case 2:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)(in_RSI + 0x60),in_stack_ffffffffffffff98);
    break;
  case 3:
    not_null<slang::syntax::ModuleHeaderSyntax_*>::get
              ((not_null<slang::syntax::ModuleHeaderSyntax_*> *)(in_RSI + 0x98));
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax ExternModuleDeclSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return externKeyword;
        case 2: return &actualAttributes;
        case 3: return header.get();
        default: return nullptr;
    }
}